

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O2

int AF_A_SelectSigilAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  int iVar2;
  DObject *this;
  player_t *this_00;
  bool bVar3;
  DPSprite *this_01;
  char *__assertion;
  DObject *this_02;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00550e6c;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_02 = (DObject *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_02 == (DObject *)0x0) {
LAB_00550da8:
        this_02 = (DObject *)0x0;
      }
      else {
        bVar3 = DObject::IsKindOf(this_02,AActor::RegistrationInfo.MyClass);
        if (!bVar3) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00550e6c;
        }
      }
      if (numparam == 1) goto LAB_00550e16;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_00550e5c;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar3) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_00550e6c;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_00550e5c;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_00550e16:
        this_00 = *(player_t **)&this_02[0xc].ObjectFlags;
        if (this_00 != (player_t *)0x0) {
          iVar2 = *(int *)&this_00->ReadyWeapon->field_0x584;
          this_01 = player_t::GetPSprite(this_00,PSP_WEAPON);
          DPSprite::SetState(this_01,this_01->State + (long)iVar2 * 4 + -3,false);
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_00550e6c;
    }
    if (this_02 == (DObject *)0x0) goto LAB_00550da8;
  }
LAB_00550e5c:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00550e6c:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                ,0x38a,"int AF_A_SelectSigilAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SelectSigilAttack)
{
	PARAM_ACTION_PROLOGUE;

	DPSprite *pspr;
	int pieces;

	if (self->player == nullptr)
	{
		return 0;
	}
	pieces = static_cast<ASigil*>(self->player->ReadyWeapon)->NumPieces;
	pspr = self->player->GetPSprite(PSP_WEAPON);
	pspr->SetState(pspr->GetState() + 4*pieces - 3);
	return 0;
}